

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ScopedElement e;
  SectionStats *in_stack_fffffffffffffeb8;
  StreamingReporterBase<Catch::XmlReporter> *in_stack_fffffffffffffec0;
  ScopedElement *this_00;
  string *in_stack_fffffffffffffec8;
  string *name;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  XmlFormatting XVar3;
  string *in_stack_fffffffffffffee0;
  XmlWriter *in_stack_fffffffffffffee8;
  XmlWriter *this_01;
  allocator<char> *__s;
  undefined1 local_f1 [40];
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [64];
  
  XVar3 = (XmlFormatting)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  StreamingReporterBase<Catch::XmlReporter>::sectionEnded
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  iVar1 = *(int *)((long)&in_RDI[0xd].field_2 + 8) + -1;
  *(int *)((long)&in_RDI[0xd].field_2 + 8) = iVar1;
  if (0 < iVar1) {
    this_01 = (XmlWriter *)&in_RDI[0xb].field_2;
    __s = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)__s,(allocator<char> *)this_01);
    operator|(Newline,Indent);
    XmlWriter::scopedElement(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,XVar3);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    XVar3 = (XmlFormatting)((ulong)&local_79 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)__s,(allocator<char> *)this_01);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(unsigned_long *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)__s,(allocator<char> *)this_01);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(unsigned_long *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)__s,(allocator<char> *)this_01);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(unsigned_long *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    peVar2 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1472d8);
    iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      name = (string *)local_f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)__s,(allocator<char> *)this_01);
      XmlWriter::ScopedElement::writeAttribute<double>
                ((ScopedElement *)CONCAT44(iVar1,in_stack_fffffffffffffed0),name,
                 (double *)in_stack_fffffffffffffec0);
      std::__cxx11::string::~string((string *)(local_f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_f1);
    }
    this_00 = (ScopedElement *)&in_RDI[0xb].field_2;
    operator|(Newline,Indent);
    XmlWriter::endElement(this_01,XVar3);
    XmlWriter::ScopedElement::~ScopedElement(this_00);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if( --m_sectionDepth > 0 ) {
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
            e.writeAttribute( "successes", sectionStats.assertions.passed );
            e.writeAttribute( "failures", sectionStats.assertions.failed );
            e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

            m_xml.endElement();
        }
    }